

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitdeque.h
# Opt level: O2

reference __thiscall
bitdeque<32768>::Iterator<false>::operator[](Iterator<false> *this,difference_type pos)

{
  Iterator<false> x;
  size_t extraout_RDX;
  long in_FS_OFFSET;
  reference rVar1;
  undefined4 in_stack_ffffffffffffffbc;
  Iterator<false> local_40;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  x._36_4_ = in_stack_ffffffffffffffbc;
  x._0_36_ = *(undefined1 (*) [36])pos;
  ::operator+(&local_40,x,(difference_type)&stack0xffffffffffffff98);
  (this->m_it)._M_cur =
       (_Elt_pointer)
       ((long)((local_40.m_it._M_cur)->super__Base_bitset<512UL>)._M_w +
       ((ulong)(long)local_40.m_bitpos >> 3 & 0xfffffffffffffff8));
  (this->m_it)._M_first = (_Elt_pointer)(ulong)(local_40.m_bitpos & 0x3f);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    rVar1._M_bpos = extraout_RDX;
    rVar1._M_wp = (_WordT *)this;
    return rVar1;
  }
  __stack_chk_fail();
}

Assistant:

reference operator[](difference_type pos) const { return *(*this + pos); }